

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void * __thiscall
std::pmr::local_malloc_free_resource::malloc_free_resource::do_allocate
          (malloc_free_resource *this,size_t bytes,size_t alignment)

{
  void *pvVar1;
  bad_alloc *this_00;
  void *rv;
  size_t alignment_local;
  size_t bytes_local;
  malloc_free_resource *this_local;
  
  pvVar1 = malloc(bytes);
  if (pvVar1 == (void *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvVar1;
}

Assistant:

[[nodiscard]] void *
            do_allocate(size_t bytes, size_t alignment) override
        {
            // While this class is local, there is no need to check the
            // alignment, as we never ask for overaligned memory
            //if (alignment > alignof(max_align_t)) {
            //    throw bad_alloc();
            //}
            void *rv = malloc(bytes);
            if (nullptr == rv) {
                throw bad_alloc();
            }
            return rv;
        }